

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

Float __thiscall pbrt::FloatImageTexture::Evaluate(FloatImageTexture *this,TextureEvalContext ctx)

{
  float fVar1;
  TextureEvalContext ctx_00;
  Vector2f dst0;
  float *pfVar2;
  long in_RDI;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 in_stack_00000008 [64];
  Point2f st;
  Vector2f dstdy;
  Vector2f dstdx;
  Vector2f *dstdy_00;
  Vector2f *in_stack_ffffffffffffff60;
  Tuple2<pbrt::Point2,_float> *this_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int i;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  Point2f *st_00;
  MIPMap *this_01;
  Tuple2<pbrt::Vector2,_float> dst1;
  float fVar5;
  float fVar6;
  Tuple2<pbrt::Point2,_float> local_28;
  Vector2f local_20 [3];
  float local_4;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_4 = *(float *)(in_RDI + 8);
  }
  else {
    Vector2<float>::Vector2((Vector2<float> *)0x6eb5aa);
    dstdy_00 = local_20;
    Vector2<float>::Vector2((Vector2<float> *)0x6eb5bc);
    auVar3 = vmovdqu64_avx512f(in_stack_00000008);
    auVar3 = vmovdqu64_avx512f(auVar3);
    st_00 = auVar3._8_8_;
    this_01 = auVar3._16_8_;
    dst1 = auVar3._28_8_;
    fVar5 = auVar3._36_4_;
    fVar6 = auVar3._40_4_;
    auVar4 = vmovdqu64_avx512f(auVar3);
    vmovdqu64_avx512f(auVar4);
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_ffffffffffffff88;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_RDI;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_RDI >> 0x20);
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_ffffffffffffff90;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         (float)(int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar3._0_8_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)auVar3._0_8_ >> 0x20);
    ctx_00._32_8_ = st_00;
    ctx_00._40_8_ = this_01;
    ctx_00.dudy = (Float)auVar3._24_4_;
    ctx_00.dvdx = dst1.x;
    ctx_00.dvdy = dst1.y;
    ctx_00.faceIndex = (int)fVar5;
    auVar3._0_8_ = TextureMapping2DHandle::Map
                             ((TextureMapping2DHandle *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),ctx_00,
                              in_stack_ffffffffffffff60,dstdy_00);
    auVar3._8_56_ = extraout_var;
    local_28 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar3._0_16_);
    this_00 = &local_28;
    i = 1;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](this_00,1);
    fVar1 = *pfVar2;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](this_00,i);
    *pfVar2 = 1.0 - fVar1;
    fVar1 = *(float *)(in_RDI + 8);
    dst0.super_Tuple2<pbrt::Vector2,_float>.y = fVar6;
    dst0.super_Tuple2<pbrt::Vector2,_float>.x = fVar5;
    local_4 = MIPMap::Lookup<float>(this_01,st_00,dst0,(Vector2f)dst1);
    local_4 = fVar1 * local_4;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
#ifdef PBRT_IS_GPU_CODE
        assert(!"Should not be called in GPU code");
        return 0;
#else
        if (!mipmap)
            return scale;
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        // Texture coordinates are (0,0) in the lower left corner, but
        // image coordinates are (0,0) in the upper left.
        st[1] = 1 - st[1];
        return scale * mipmap->Lookup<Float>(st, dstdx, dstdy);
#endif
    }